

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem singlestep(lua_State *L)

{
  global_State *g_00;
  GCObject *pGVar1;
  lu_mem lVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  lu_mem lVar5;
  lu_mem lVar6;
  lu_mem lVar7;
  global_State *pgVar8;
  int iVar9;
  GCObject **ppGVar10;
  lu_mem lVar11;
  char *pcVar12;
  GCObject *f;
  GCObject *f_00;
  global_State *g;
  long lVar13;
  uint newsize;
  UpVal *pUVar14;
  ulong uVar15;
  GCObject *mt;
  GCObject *local_38;
  
  g_00 = L->l_G;
  lVar11 = 0;
  switch(g_00->gcstate) {
  case '\0':
    if (g_00->gray == (GCObject *)0x0) {
      g_00->gcstate = '\x01';
      lVar11 = g_00->GCmemtrav;
      g_00->GCestimate = lVar11;
      if ((L != (lua_State *)0x0) && ((L->marked & 3) != 0)) {
        reallymarkobject(g_00,(GCObject *)L);
      }
      if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
         (pGVar1 = (g_00->l_registry).value_.gc, ((pGVar1->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar1);
      }
      markmt(g_00);
      for (pUVar14 = (g_00->uvhead).u.l.next; pUVar14 != &g_00->uvhead;
          pUVar14 = (pUVar14->u).l.next) {
        if ((((pUVar14->marked & 7) == 0) && ((pUVar14->v->tt_ & 0x40) != 0)) &&
           (pGVar1 = (pUVar14->v->value_).gc, ((pGVar1->gch).marked & 3) != 0)) {
          reallymarkobject(g_00,pGVar1);
        }
      }
      while (g_00->gray != (GCObject *)0x0) {
        propagatemark(g_00);
      }
      lVar2 = g_00->GCmemtrav;
      pGVar1 = g_00->grayagain;
      pGVar3 = g_00->weak;
      pGVar4 = g_00->ephemeron;
      g_00->grayagain = (GCObject *)0x0;
      g_00->weak = (GCObject *)0x0;
      g_00->ephemeron = (GCObject *)0x0;
      while (g_00->gray != (GCObject *)0x0) {
        propagatemark(g_00);
      }
      g_00->gray = pGVar1;
      while (pGVar1 != (GCObject *)0x0) {
        propagatemark(g_00);
        pGVar1 = g_00->gray;
      }
      g_00->gray = pGVar3;
      while (pGVar3 != (GCObject *)0x0) {
        propagatemark(g_00);
        pGVar3 = g_00->gray;
      }
      g_00->gray = pGVar4;
      while (pGVar4 != (GCObject *)0x0) {
        propagatemark(g_00);
        pGVar4 = g_00->gray;
      }
      lVar5 = g_00->GCmemtrav;
      convergeephemerons(g_00);
      clearvalues(g_00,g_00->weak,(GCObject *)0x0);
      clearvalues(g_00,g_00->allweak,(GCObject *)0x0);
      lVar6 = g_00->GCmemtrav;
      pGVar1 = g_00->weak;
      pGVar3 = g_00->allweak;
      separatetobefnz(L,0);
      markbeingfnz(g_00);
      while (g_00->gray != (GCObject *)0x0) {
        propagatemark(g_00);
      }
      lVar7 = g_00->GCmemtrav;
      convergeephemerons(g_00);
      clearkeys(g_00,g_00->ephemeron,f);
      clearkeys(g_00,g_00->allweak,f_00);
      clearvalues(g_00,g_00->weak,pGVar1);
      clearvalues(g_00,g_00->allweak,pGVar3);
      g_00->currentwhite = g_00->currentwhite ^ 3;
      lVar13 = ((lVar2 + lVar6) - (lVar11 + lVar5 + lVar7)) + g_00->GCmemtrav;
      g_00->GCestimate = g_00->GCestimate + lVar13;
      iVar9 = entersweep(L);
      lVar11 = (long)iVar9 * 7 + lVar13;
    }
    else {
      lVar11 = g_00->GCmemtrav;
      propagatemark(g_00);
      lVar11 = g_00->GCmemtrav - lVar11;
    }
    break;
  case '\x02':
    uVar15 = 0;
    do {
      if ((g_00->strt).size <= (int)uVar15 + g_00->sweepstrgc) goto LAB_00109fae;
      sweeplist(L,(g_00->strt).hash + (long)g_00->sweepstrgc + uVar15,0xfffffffffffffffd);
      uVar15 = uVar15 + 1;
    } while ((int)uVar15 != 0x55);
    uVar15 = 0x55;
LAB_00109fae:
    iVar9 = g_00->sweepstrgc + (int)uVar15;
    g_00->sweepstrgc = iVar9;
    if ((g_00->strt).size <= iVar9) {
      g_00->gcstate = '\x03';
    }
    lVar11 = (uVar15 & 0xffffffff) * 7;
    break;
  case '\x03':
    if (g_00->sweepfin == (GCObject **)0x0) {
      g_00->gcstate = '\x04';
      return 0;
    }
    ppGVar10 = sweeplist(L,g_00->sweepfin,0x55);
    g_00->sweepfin = ppGVar10;
    goto LAB_00109ff1;
  case '\x04':
    if (g_00->sweepgc == (GCObject **)0x0) {
      local_38 = (GCObject *)g_00->mainthread;
      sweeplist(L,&local_38,1);
      pgVar8 = L->l_G;
      if (pgVar8->gckind != '\x01') {
        newsize = (pgVar8->strt).size / 2;
        if ((pgVar8->strt).nuse < newsize) {
          luaS_resize(L,newsize);
        }
        pcVar12 = (char *)luaM_realloc_(L,(pgVar8->buff).buffer,(pgVar8->buff).buffsize,0);
        (pgVar8->buff).buffer = pcVar12;
        (pgVar8->buff).buffsize = 0;
      }
      g_00->gcstate = '\x05';
      return 7;
    }
    ppGVar10 = sweeplist(L,g_00->sweepgc,0x55);
    g_00->sweepgc = ppGVar10;
LAB_00109ff1:
    lVar11 = 0x253;
    break;
  case '\x05':
    g_00->GCmemtrav = (long)(g_00->strt).size << 3;
    g_00->gray = (GCObject *)0x0;
    g_00->grayagain = (GCObject *)0x0;
    g_00->weak = (GCObject *)0x0;
    g_00->ephemeron = (GCObject *)0x0;
    g_00->allweak = (GCObject *)0x0;
    pGVar1 = (GCObject *)g_00->mainthread;
    if ((pGVar1 != (GCObject *)0x0) && (((pGVar1->gch).marked & 3) != 0)) {
      reallymarkobject(g_00,pGVar1);
    }
    if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
       (pGVar1 = (g_00->l_registry).value_.gc, ((pGVar1->gch).marked & 3) != 0)) {
      reallymarkobject(g_00,pGVar1);
    }
    markmt(g_00);
    markbeingfnz(g_00);
    g_00->gcstate = '\0';
    lVar11 = g_00->GCmemtrav;
  }
  return lVar11;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  switch (g->gcstate) {
    case GCSpause: {
      /* start to count memory traversed */
      g->GCmemtrav = g->strt.size * sizeof(GCObject*);
      lua_assert(!isgenerational(g));
      restartcollection(g);
      g->gcstate = GCSpropagate;
      return g->GCmemtrav;
    }
    case GCSpropagate: {
      if (g->gray) {
        lu_mem oldtrav = g->GCmemtrav;
        propagatemark(g);
        return g->GCmemtrav - oldtrav;  /* memory traversed in this step */
      }
      else {  /* no more `gray' objects */
        lu_mem work;
        int sw;
        g->gcstate = GCSatomic;  /* finish mark phase */
        g->GCestimate = g->GCmemtrav;  /* save what was counted */;
        work = atomic(L);  /* add what was traversed by 'atomic' */
        g->GCestimate += work;  /* estimate of total memory traversed */ 
        sw = entersweep(L);
        return work + sw * GCSWEEPCOST;
      }
    }
    case GCSsweepstring: {
      int i;
      for (i = 0; i < GCSWEEPMAX && g->sweepstrgc + i < g->strt.size; i++)
        sweepwholelist(L, &g->strt.hash[g->sweepstrgc + i]);
      g->sweepstrgc += i;
      if (g->sweepstrgc >= g->strt.size)  /* no more strings to sweep? */
        g->gcstate = GCSsweepudata;
      return i * GCSWEEPCOST;
    }
    case GCSsweepudata: {
      if (g->sweepfin) {
        g->sweepfin = sweeplist(L, g->sweepfin, GCSWEEPMAX);
        return GCSWEEPMAX*GCSWEEPCOST;
      }
      else {
        g->gcstate = GCSsweep;
        return 0;
      }
    }
    case GCSsweep: {
      if (g->sweepgc) {
        g->sweepgc = sweeplist(L, g->sweepgc, GCSWEEPMAX);
        return GCSWEEPMAX*GCSWEEPCOST;
      }
      else {
        /* sweep main thread */
        GCObject *mt = obj2gco(g->mainthread);
        sweeplist(L, &mt, 1);
        checkSizes(L);
        g->gcstate = GCSpause;  /* finish collection */
        return GCSWEEPCOST;
      }
    }
    default: lua_assert(0); return 0;
  }
}